

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

size_t tcg_code_capacity_riscv32(TCGContext_conflict9 *tcg_ctx)

{
  long lVar1;
  
  lVar1 = (tcg_ctx->region).stride - (tcg_ctx->region).size;
  return (long)(tcg_ctx->region).end +
         (-0x400 - lVar1) * (tcg_ctx->region).n + (lVar1 - (long)(tcg_ctx->region).start);
}

Assistant:

size_t tcg_code_capacity(TCGContext *tcg_ctx)
{
    size_t guard_size, capacity;

    /* no need for synchronization; these variables are set at init time */
    guard_size = tcg_ctx->region.stride - tcg_ctx->region.size;
    capacity = (char *)tcg_ctx->region.end + guard_size - (char *)tcg_ctx->region.start;
    capacity -= tcg_ctx->region.n * (guard_size + TCG_HIGHWATER);
    return capacity;
}